

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree.h
# Opt level: O0

Position __thiscall
absl::lts_20250127::cord_internal::CordRepBtree::IndexBeyond(CordRepBtree *this,size_t offset)

{
  Position PVar1;
  size_t local_38;
  size_t index;
  size_t off;
  size_t offset_local;
  CordRepBtree *this_local;
  
  index = 0;
  local_38 = begin(this);
  while (index < offset) {
    index = this->edges_[local_38]->length + index;
    local_38 = local_38 + 1;
  }
  PVar1.n = index - offset;
  PVar1.index = local_38;
  return PVar1;
}

Assistant:

inline CordRepBtree::Position CordRepBtree::IndexBeyond(
    const size_t offset) const {
  // We need to find the edge which `starting offset` is beyond (>=)`offset`.
  // For this we can't use the `offset -= length` logic of IndexOf. Instead, we
  // track the offset of the `current edge` in `off`, which we increase as we
  // iterate over the edges until we find the matching edge.
  size_t off = 0;
  size_t index = begin();
  while (offset > off) off += edges_[index++]->length;
  return {index, off - offset};
}